

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.hpp
# Opt level: O0

void __thiscall pstore::repo::section_content::~section_content(section_content *this)

{
  section_content *this_local;
  
  std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>::~vector
            (&this->xfixups);
  std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>::~vector
            (&this->ifixups);
  small_vector<unsigned_char,_128UL>::~small_vector(&this->data);
  return;
}

Assistant:

explicit section_content (section_kind const kind_) noexcept
                    : kind{kind_} {}